

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O3

options_description * __thiscall
program_options::options_description::add(options_description *this,options_description *desc)

{
  ulong uVar1;
  ulong *puVar2;
  options_description *this_00;
  pointer psVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  shared_ptr<program_options::options_description> d;
  value_type local_58;
  vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
  *local_48;
  value_type local_40;
  
  this_00 = (options_description *)operator_new(0x80);
  options_description(this_00,desc);
  local_40.super___shared_ptr<program_options::options_description,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<program_options::options_description*>
            (&local_40.
              super___shared_ptr<program_options::options_description,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  std::
  vector<std::shared_ptr<program_options::options_description>,_std::allocator<std::shared_ptr<program_options::options_description>_>_>
  ::push_back(&this->groups,&local_40);
  psVar3 = (desc->m_options).
           super__Vector_base<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((desc->m_options).
      super__Vector_base<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    local_48 = &this->m_options;
    lVar5 = 8;
    uVar6 = 0;
    do {
      local_58.super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)((long)psVar3 + lVar5 + -8);
      local_58.super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(psVar3->
                    super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr + lVar5);
      if (local_58.
          super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.
           super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.
                super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.
           super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.
                super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
      ::push_back(local_48,&local_58);
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->belong_to_group,false);
      if (local_58.
          super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      uVar4 = (ulong)(this->belong_to_group).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      uVar1 = uVar4 - 1;
      uVar4 = uVar4 + 0x3e;
      if (-1 < (long)uVar1) {
        uVar4 = uVar1;
      }
      puVar2 = (this->belong_to_group).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
               ((long)uVar4 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)
      ;
      *puVar2 = *puVar2 | 1L << ((byte)uVar1 & 0x3f);
      uVar6 = uVar6 + 1;
      psVar3 = (desc->m_options).
               super__Vector_base<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(desc->m_options).
                                   super__Vector_base<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  if (local_40.super___shared_ptr<program_options::options_description,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<program_options::options_description,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return this;
}

Assistant:

options_description& options_description::add(const options_description& desc)
{
    std::shared_ptr<options_description> d(new options_description(desc));
    groups.push_back(d);

    for (size_t i = 0; i < desc.m_options.size(); ++i) {
        add(desc.m_options[i]);
        belong_to_group.back() = true;
    }

    return *this;
}